

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellBST::ComputeNF
          (ChElementShellBST *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  char *__function;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  *detJ = this->area + this->area;
  uVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar5 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (uVar5 == 0) {
    if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
    goto LAB_00784f39;
LAB_00784f22:
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    memset((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           uVar5 * 8);
    if (2 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      if (uVar5 < 3) goto LAB_00784f22;
      pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar3 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar4 = 3;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar6 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar6 < 3) {
          uVar4 = (ulong)uVar6;
        }
        if (uVar6 != 0) goto LAB_00784dd3;
        uVar4 = 0;
LAB_00784df0:
        do {
          pdVar3[uVar4] = U * pdVar1[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      else {
LAB_00784dd3:
        uVar7 = 0;
        do {
          pdVar3[uVar7] = U * pdVar1[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
        if ((int)uVar4 != 3) goto LAB_00784df0;
      }
      if (2 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        if ((long)uVar5 < 6) goto LAB_00784f22;
        pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar5 = 3;
        pdVar3 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 3;
        if (((ulong)pdVar3 & 7) == 0) {
          uVar6 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar6 < 3) {
            uVar5 = (ulong)uVar6;
          }
          if (uVar6 != 0) goto LAB_00784e42;
          uVar5 = 0;
LAB_00784e5f:
          do {
            pdVar3[uVar5] = V * pdVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar5 != 3);
        }
        else {
LAB_00784e42:
          uVar4 = 0;
          do {
            pdVar3[uVar4] = V * pdVar1[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
          if ((int)uVar5 != 3) goto LAB_00784e5f;
        }
        if (2 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
           ) {
          if (8 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
            pdVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            uVar5 = 3;
            pdVar3 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + 6;
            dVar2 = (1.0 - U) - V;
            if (((ulong)pdVar3 & 7) == 0) {
              uVar6 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
              if ((ulong)uVar6 < 3) {
                uVar5 = (ulong)uVar6;
              }
              if (uVar6 == 0) {
                uVar5 = 0;
                goto LAB_00784edf;
              }
            }
            uVar4 = 0;
            do {
              pdVar3[uVar4] = dVar2 * pdVar1[uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar5 != uVar4);
            if ((int)uVar5 == 3) {
              return;
            }
LAB_00784edf:
            do {
              pdVar3[uVar5] = dVar2 * pdVar1[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar5 != 3);
            return;
          }
          goto LAB_00784f22;
        }
      }
    }
LAB_00784f39:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementShellBST::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

    // det of jacobian at u,v
    detJ = this->area*2.0;  

	Qi.setZero();

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);

    Qi.segment(3, 3) = N(1) * F.segment(0, 3);

    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}